

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_sl_Array.h
# Opt level: O0

int __thiscall
axl::sl::Array<unsigned_long,_axl::sl::ArrayDetails<unsigned_long>_>::copy
          (Array<unsigned_long,_axl::sl::ArrayDetails<unsigned_long>_> *this,EVP_PKEY_CTX *dst,
          EVP_PKEY_CTX *src)

{
  bool bVar1;
  bool result;
  unsigned_long *end;
  Ptr<void> shadow;
  size_t in_stack_ffffffffffffff88;
  undefined7 in_stack_ffffffffffffff90;
  undefined1 in_stack_ffffffffffffff97;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  EVP_PKEY_CTX *local_8;
  
  if (src == (EVP_PKEY_CTX *)0x0) {
    clear((Array<unsigned_long,_axl::sl::ArrayDetails<unsigned_long>_> *)0x10d21f);
    local_8._0_4_ = 0;
  }
  else {
    rc::Ptr<void>::Ptr((Ptr<void> *)0x10d237);
    local_8 = src;
    if (((this->super_ArrayRef<unsigned_long,_axl::sl::ArrayDetails<unsigned_long>_>).m_hdr ==
         (Hdr *)0x0) ||
       (bVar1 = rc::BufHdr::isInsideBuffer
                          ((BufHdr *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                           this), !bVar1)) {
      bVar1 = setCount((Array<unsigned_long,_axl::sl::ArrayDetails<unsigned_long>_> *)
                       CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90),
                       in_stack_ffffffffffffff88);
      if (bVar1) {
        SimpleArrayDetails<unsigned_long>::copy
                  ((SimpleArrayDetails<unsigned_long> *)
                   (this->super_ArrayRef<unsigned_long,_axl::sl::ArrayDetails<unsigned_long>_>).m_p,
                   dst,src);
      }
      else {
        local_8 = (EVP_PKEY_CTX *)0xffffffffffffffff;
      }
    }
    else {
      rc::BufHdr::getEnd((this->super_ArrayRef<unsigned_long,_axl::sl::ArrayDetails<unsigned_long>_>
                         ).m_hdr);
      (this->super_ArrayRef<unsigned_long,_axl::sl::ArrayDetails<unsigned_long>_>).m_p =
           (unsigned_long *)dst;
      (this->super_ArrayRef<unsigned_long,_axl::sl::ArrayDetails<unsigned_long>_>).m_count =
           (size_t)src;
    }
    rc::Ptr<void>::~Ptr((Ptr<void> *)0x10d33b);
  }
  return (int)local_8;
}

Assistant:

size_t
	copy(
		const T* p,
		size_t count
	) {
		if (count == 0) {
			clear();
			return 0;
		}

		rc::Ptr<void> shadow;
		if (this->m_hdr && this->m_hdr->isInsideBuffer(p))
			if (Details::IsSimple) {
				// for simple non-ctor-dtor types we can apply in-buffer shift

				T* end = (T*)this->m_hdr->getEnd();
				ASSERT(p + count <= end);

				this->m_p = (T*)p;
				this->m_count = count;
				return count;
			} else {
				shadow = this->m_hdr; // ensure we keep p intact
			}

		bool result = setCount(count);
		if (!result)
			return -1;

		Details::copy(this->m_p, p, count);
		return count;
	}